

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_mac.c
# Opt level: O1

void beltMACStepG_internal(void *state)

{
  if (*(long *)((long)state + 0x60) == 0x10) {
    *(uint *)((long)state + 0x40) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x20);
    *(uint *)((long)state + 0x44) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x24);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x28);
    *(uint *)((long)state + 0x4c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x2c);
    *(ulong *)((long)state + 0x40) = *(ulong *)((long)state + 0x40) ^ *(ulong *)((long)state + 0x34)
    ;
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x48) ^ *(uint *)((long)state + 0x3c);
    *(uint *)((long)state + 0x4c) =
         (uint)*(ulong *)((long)state + 0x34) ^
         *(uint *)((long)state + 0x30) ^ *(uint *)((long)state + 0x4c);
  }
  else {
    *(undefined1 *)((long)state + *(long *)((long)state + 0x60) + 0x50) = 0x80;
    memSet((void *)((long)state + *(long *)((long)state + 0x60) + 0x51),'\0',
           0xf - *(long *)((long)state + 0x60));
    *(uint *)((long)state + 0x40) = *(uint *)((long)state + 0x50) ^ *(uint *)((long)state + 0x20);
    *(uint *)((long)state + 0x44) = *(uint *)((long)state + 0x54) ^ *(uint *)((long)state + 0x24);
    *(uint *)((long)state + 0x48) = *(uint *)((long)state + 0x58) ^ *(uint *)((long)state + 0x28);
    *(uint *)((long)state + 0x4c) = *(uint *)((long)state + 0x5c) ^ *(uint *)((long)state + 0x2c);
    *(uint *)((long)state + 0x40) =
         (uint)*(ulong *)((long)state + 0x30) ^
         *(uint *)((long)state + 0x3c) ^ *(uint *)((long)state + 0x40);
    *(ulong *)((long)state + 0x44) = *(ulong *)((long)state + 0x44) ^ *(ulong *)((long)state + 0x30)
    ;
    *(uint *)((long)state + 0x4c) = *(uint *)((long)state + 0x4c) ^ *(uint *)((long)state + 0x38);
  }
  beltBlockEncr2((u32 *)((long)state + 0x40),(u32 *)state);
  return;
}

Assistant:

static void beltMACStepG_internal(void* state)
{
	belt_mac_st* st = (belt_mac_st*)state;
	ASSERT(memIsValid(state, beltMAC_keep()));
	// полный блок?
	if (st->filled == 16)
	{
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[1];
		st->mac[1] ^= st->r[2];
		st->mac[2] ^= st->r[3];
		st->mac[3] ^= st->r[0] ^ st->r[1];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	// неполный (в т.ч. пустой) блок?
	else
	{
		st->block[st->filled] = 0x80;
		memSetZero(st->block + st->filled + 1, 16 - st->filled - 1);
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
		beltBlockXor(st->mac, st->s, st->block);
		st->mac[0] ^= st->r[0] ^ st->r[3];
		st->mac[1] ^= st->r[0];
		st->mac[2] ^= st->r[1];
		st->mac[3] ^= st->r[2];
#if (OCTET_ORDER == BIG_ENDIAN)
		beltBlockRevU32(st->block);
#endif
	}
	beltBlockEncr2(st->mac, st->key);
}